

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateProvides
          (Generator *this,GeneratorOptions *options,Printer *printer,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *provided)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  LogMessage *in_RDX;
  long in_RSI;
  string namespaceObject;
  iterator it;
  LogMessage *in_stack_ffffffffffffff38;
  LogMessage *in_stack_ffffffffffffff40;
  string *this_00;
  undefined4 in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char (*in_stack_ffffffffffffff90) [5];
  char *in_stack_ffffffffffffff98;
  Printer *in_stack_ffffffffffffffa0;
  string local_50 [32];
  _Self local_30;
  _Self local_28 [2];
  LogMessage *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff38);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff38);
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) break;
    if (*(int *)(local_10 + 0x44) == 0) {
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x4638c7);
      io::Printer::Print<char[5],std::__cxx11::string>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
    }
    else if (*(int *)(local_10 + 0x44) == 2) {
      pbVar3 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x463906);
      this_00 = local_50;
      std::__cxx11::string::string(this_00,(string *)pbVar3);
      iVar2 = std::__cxx11::string::compare((ulong)this_00,0,(char *)0x6);
      if (iVar2 != 0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)CONCAT44(iVar2,in_stack_ffffffffffffff50),
                   (LogLevel)((ulong)this_00 >> 0x20),(char *)in_stack_ffffffffffffff40,
                   (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        in_stack_ffffffffffffff40 =
             internal::LogMessage::operator<<
                       (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        internal::LogMessage::~LogMessage((LogMessage *)0x4639a9);
      }
      std::__cxx11::string::erase((ulong)local_50,0);
      io::Printer::Print<char[5],std::__cxx11::string>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
      std::__cxx11::string::~string(local_50);
    }
    else {
      in_stack_ffffffffffffff38 = local_18;
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x463a44);
      io::Printer::Print<char[5],std::__cxx11::string>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

void Generator::GenerateProvides(const GeneratorOptions& options,
                                 io::Printer* printer,
                                 std::set<std::string>* provided) const {
  for (std::set<std::string>::iterator it = provided->begin();
       it != provided->end(); ++it) {
    if (options.import_style == GeneratorOptions::kImportClosure) {
      printer->Print("goog.provide('$name$');\n", "name", *it);
    } else {
      // We aren't using Closure's import system, but we use goog.exportSymbol()
      // to construct the expected tree of objects, eg.
      //
      //   goog.exportSymbol('foo.bar.Baz', null, this);
      //
      //   // Later generated code expects foo.bar = {} to exist:
      //   foo.bar.Baz = function() { /* ... */ }

      // Do not use global scope in strict mode
      if (options.import_style == GeneratorOptions::kImportCommonJsStrict) {
        std::string namespaceObject = *it;
        // Remove "proto." from the namespace object
        GOOGLE_CHECK_EQ(0, namespaceObject.compare(0, 6, "proto."));
        namespaceObject.erase(0, 6);
        printer->Print("goog.exportSymbol('$name$', null, proto);\n", "name",
                       namespaceObject);
      } else {
        printer->Print("goog.exportSymbol('$name$', null, global);\n", "name",
                       *it);
      }
    }
  }
}